

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

void xcb_input_feedback_ctl_next(xcb_input_feedback_ctl_iterator_t *i)

{
  xcb_input_feedback_ctl_t *pxVar1;
  int iVar2;
  xcb_input_feedback_ctl_t *_aux;
  long in_FS_OFFSET;
  xcb_input_feedback_ctl_data_t xStack_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pxVar1 = i->data;
  iVar2 = xcb_input_feedback_ctl_data_unpack(pxVar1 + 1,pxVar1->class_id,&xStack_58);
  i->index = (int)(xcb_input_feedback_ctl_t *)(&pxVar1->class_id + (iVar2 + 4)) - *(int *)&i->data;
  i->rem = i->rem + -1;
  i->data = (xcb_input_feedback_ctl_t *)(&pxVar1->class_id + (iVar2 + 4));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
xcb_input_feedback_ctl_next (xcb_input_feedback_ctl_iterator_t *i)
{
    xcb_input_feedback_ctl_t *R = i->data;
    xcb_generic_iterator_t child;
    child.data = (xcb_input_feedback_ctl_t *)(((char *)R) + xcb_input_feedback_ctl_sizeof(R));
    i->index = (char *) child.data - (char *) i->data;
    --i->rem;
    i->data = (xcb_input_feedback_ctl_t *) child.data;
}